

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O1

void Gia_ManIncrementTravId(Gia_Man_t *p)

{
  int iVar1;
  int *piVar2;
  size_t sVar3;
  
  if (p->pTravIds == (int *)0x0) {
    sVar3 = (long)p->nObjs + 100;
    p->nTravIdsAlloc = (int)sVar3;
    piVar2 = (int *)calloc(sVar3,4);
    p->pTravIds = piVar2;
    p->nTravIds = 0;
  }
  iVar1 = p->nTravIdsAlloc;
  if (iVar1 < p->nObjs) {
    do {
      p->nTravIdsAlloc = iVar1 * 2;
      sVar3 = (long)(iVar1 * 2) << 2;
      if (p->pTravIds == (int *)0x0) {
        piVar2 = (int *)malloc(sVar3);
      }
      else {
        piVar2 = (int *)realloc(p->pTravIds,sVar3);
      }
      p->pTravIds = piVar2;
      memset(piVar2 + p->nTravIdsAlloc / 2,0,(long)p->nTravIdsAlloc * 2 & 0x7ffffffffffffffe);
      iVar1 = p->nTravIdsAlloc;
    } while (iVar1 < p->nObjs);
  }
  p->nTravIds = p->nTravIds + 1;
  return;
}

Assistant:

void Gia_ManIncrementTravId( Gia_Man_t * p )                     
{ 
    if ( p->pTravIds == NULL )
    {
        p->nTravIdsAlloc = Gia_ManObjNum(p) + 100; 
        p->pTravIds = ABC_CALLOC( int, p->nTravIdsAlloc ); 
        p->nTravIds = 0;  
    }
    while ( p->nTravIdsAlloc < Gia_ManObjNum(p) )
    {
        p->nTravIdsAlloc *= 2;
        p->pTravIds = ABC_REALLOC( int, p->pTravIds, p->nTravIdsAlloc );
        memset( p->pTravIds + p->nTravIdsAlloc/2, 0, sizeof(int) * p->nTravIdsAlloc/2 );
    }
    p->nTravIds++;                                                    
}